

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageinfo.cxx
# Opt level: O2

string * vigra::detail::trimString(string *__return_storage_ptr__,string *s)

{
  pointer pcVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  
  pcVar1 = (s->_M_dataplus)._M_p;
  uVar2 = s->_M_string_length;
  for (uVar4 = 0;
      (uVar5 = (ulong)uVar4, uVar5 < uVar2 && ((pcVar1[uVar5] == ' ' || (pcVar1[uVar5] == '\t'))));
      uVar4 = uVar4 + 1) {
  }
  do {
    uVar3 = uVar2;
    if (uVar3 == 0) break;
    uVar2 = uVar3 - 1;
  } while ((pcVar1[uVar3 - 1] == ' ') || (pcVar1[uVar3 - 1] == '\t'));
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)__return_storage_ptr__,pcVar1 + uVar5,pcVar1 + uVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string trimString(const std::string &s)
{
    unsigned int begin = 0;
    while(begin < s.size() && ((s[begin] == ' ') || (s[begin] == '\t')))
        ++begin;
    std::size_t end = s.size();
    while(end > 0 && ((s[end-1] == ' ') || (s[end-1] == '\t')))
        --end;
    return std::string(s.begin() + begin, s.begin() + end);
}